

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  _Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false> _Var1;
  Stack<std::unique_ptr<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>_>
  *this_00;
  _Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false> local_10;
  
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
       .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl;
  if (((_Var1._M_head_impl != (Stack<Indexing::CodeTree::CodeOp_*> *)0x0) &&
      ((_Var1._M_head_impl)->_capacity != 0)) &&
     (Recycled<Lib::Stack<Indexing::CodeTree::CodeOp*>,Lib::DefaultReset,Lib::DefaultKeepRecycled>::
      memAlive == '\x01')) {
    (_Var1._M_head_impl)->_cursor = (_Var1._M_head_impl)->_stack;
    this_00 = mem();
    local_10._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl =
         (Stack<Indexing::CodeTree::CodeOp_*> *)0x0;
    Stack<std::unique_ptr<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>_>
    ::push(this_00,(unique_ptr<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                    *)&local_10);
    std::
    unique_ptr<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
    ::~unique_ptr((unique_ptr<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                   *)&local_10);
  }
  std::
  unique_ptr<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }